

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O2

ChStreamOutBinary * __thiscall
chrono::ChStreamOutBinary::operator<<(ChStreamOutBinary *this,uint Val)

{
  undefined8 in_RAX;
  _func_int **pp_Var1;
  uint *ptData;
  uint Val_local;
  uint tmp;
  
  ptData = &Val_local;
  _Val_local = CONCAT44((uint)((ulong)in_RAX >> 0x20),Val);
  if ((this->super_ChBinaryArchive).big_endian_machine == true) {
    ptData = &tmp;
    _Val_local = CONCAT44(Val,Val);
    StreamSwapBytes<unsigned_int>(ptData);
    pp_Var1 = (this->super_ChStreamOut)._vptr_ChStreamOut;
  }
  else {
    pp_Var1 = (this->super_ChStreamOut)._vptr_ChStreamOut;
  }
  (*pp_Var1[2])(this,ptData,4);
  return this;
}

Assistant:

ChStreamOutBinary& ChStreamOutBinary::operator<<(unsigned int Val) {
    if (big_endian_machine) {
        unsigned int tmp = Val;
        StreamSwapBytes<unsigned int>(&tmp);
        this->Output((char*)&tmp, sizeof(unsigned int));
    } else {
        this->Output((char*)&Val, sizeof(unsigned int));
    }
    return (*this);
}